

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmType anon_unknown.dwarf_1a3010::GetLoadResultType(ExpressionContext *ctx,TypeBase *type)

{
  bool bVar1;
  VmType VVar2;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  TypeBase *local_10;
  
  if ((((type == ctx->typeBool) || (type == ctx->typeChar)) || (type == ctx->typeShort)) ||
     (type == ctx->typeInt)) {
    local_10 = VmType::Int.structType;
    ctx_local = (ExpressionContext *)VmType::Int._0_8_;
  }
  else if ((type == ctx->typeFloat) || (type == ctx->typeDouble)) {
    local_10 = VmType::Double.structType;
    ctx_local = (ExpressionContext *)VmType::Double._0_8_;
  }
  else if (type == ctx->typeLong) {
    local_10 = VmType::Long.structType;
    ctx_local = (ExpressionContext *)VmType::Long._0_8_;
  }
  else {
    bVar1 = isType<TypeRef>(type);
    if (bVar1) {
      _ctx_local = VmType::Pointer(type);
    }
    else {
      bVar1 = isType<TypeFunction>(type);
      if (bVar1) {
        _ctx_local = VmType::FunctionRef(type);
      }
      else {
        bVar1 = isType<TypeUnsizedArray>(type);
        if (bVar1) {
          _ctx_local = VmType::ArrayRef(type);
        }
        else if ((TypeStruct *)type == ctx->typeAutoRef) {
          local_10 = VmType::AutoRef.structType;
          ctx_local = (ExpressionContext *)VmType::AutoRef._0_8_;
        }
        else if ((TypeStruct *)type == ctx->typeAutoArray) {
          local_10 = VmType::AutoArray.structType;
          ctx_local = (ExpressionContext *)VmType::AutoArray._0_8_;
        }
        else {
          bVar1 = isType<TypeTypeID>(type);
          if (((!bVar1) && (bVar1 = isType<TypeFunctionID>(type), !bVar1)) &&
             (bVar1 = isType<TypeEnum>(type), !bVar1)) {
            bVar1 = isType<TypeNullptr>(type);
            if (bVar1) {
              VVar2 = VmType::Pointer(type);
              return VVar2;
            }
            if (type->size == 0) {
              __assert_fail("type->size != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1e1,
                            "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                           );
            }
            if (type->size % 4 != 0) {
              __assert_fail("type->size % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1e2,
                            "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                           );
            }
            if (type->size < 0x10000000) {
              VVar2 = VmType::Struct(type->size,type);
              return VVar2;
            }
            __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1e3,
                          "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                         );
          }
          local_10 = VmType::Int.structType;
          ctx_local = (ExpressionContext *)VmType::Int._0_8_;
        }
      }
    }
  }
  return _ctx_local;
}

Assistant:

VmType GetLoadResultType(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar || type == ctx.typeShort || type == ctx.typeInt)
			return VmType::Int;

		if(type == ctx.typeFloat || type == ctx.typeDouble)
			return VmType::Double;

		if(type == ctx.typeLong)
			return VmType::Long;

		if(isType<TypeRef>(type))
			return VmType::Pointer(type);

		if(isType<TypeFunction>(type))
			return VmType::FunctionRef(type);

		if(isType<TypeUnsizedArray>(type))
			return VmType::ArrayRef(type);

		if(type == ctx.typeAutoRef)
			return VmType::AutoRef;

		if(type == ctx.typeAutoArray)
			return VmType::AutoArray;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VmType::Int;

		if(isType<TypeNullptr>(type))
			return VmType::Pointer(type);

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VmType::Struct(type->size, type);
	}